

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callgrind_converter.cpp
# Opt level: O0

void __thiscall
HawkTracer::client::CallgrindConverter::process_event(CallgrindConverter *this,Event *event)

{
  bool bVar1;
  uint uVar2;
  unsigned_long uVar3;
  vector<HawkTracer::client::CallGraph::NodeData,std::allocator<HawkTracer::client::CallGraph::NodeData>>
  *this_00;
  unsigned_long local_b8;
  allocator local_a9;
  string local_a8 [32];
  unsigned_long local_88;
  HT_DurationNs duration;
  HT_TimestampNs start_ts;
  string local_70 [36];
  uint local_4c;
  uint local_48;
  HT_ThreadId thread_id;
  undefined1 local_38 [8];
  string label;
  Event *event_local;
  CallgrindConverter *this_local;
  
  Converter::_get_label_abi_cxx11_((Converter *)local_38,(Event *)this);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"");
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"thread_id",(allocator *)((long)&start_ts + 7));
    start_ts._0_4_ = 0;
    uVar2 = parser::Event::get_value_or_default<unsigned_int>
                      (event,(string *)local_70,(uint *)&start_ts);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)((long)&start_ts + 7));
    local_4c = uVar2;
    duration = parser::Event::get_timestamp(event);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"duration",&local_a9);
    local_b8 = 0;
    uVar3 = parser::Event::get_value_or_default<unsigned_long>(event,(string *)local_a8,&local_b8);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    local_88 = uVar3;
    this_00 = (vector<HawkTracer::client::CallGraph::NodeData,std::allocator<HawkTracer::client::CallGraph::NodeData>>
               *)std::
                 unordered_map<unsigned_int,_std::vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>_>_>_>
                 ::operator[](&this->_events,&local_4c);
    std::
    vector<HawkTracer::client::CallGraph::NodeData,std::allocator<HawkTracer::client::CallGraph::NodeData>>
    ::emplace_back<std::__cxx11::string&,unsigned_long&,unsigned_long&>
              (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38
               ,&duration,&local_88);
  }
  local_48 = (uint)bVar1;
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void CallgrindConverter::process_event(const parser::Event& event)
{
    std::string label = _get_label(event);

    if (label == "")
    {
        return;
    }
    HT_ThreadId thread_id = event.get_value_or_default<HT_ThreadId>("thread_id", 0u);
    HT_TimestampNs start_ts = event.get_timestamp();
    HT_DurationNs duration = event.get_value_or_default<HT_DurationNs>("duration", 0u);
    _events[thread_id].emplace_back(label, start_ts, duration);
}